

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

void ktxTexture_destruct(ktxTexture *This)

{
  long in_RDI;
  ktxStream stream;
  undefined1 local_70 [32];
  ktxHashList *in_stack_ffffffffffffffb0;
  code *local_40;
  long local_30;
  
  memcpy(local_70,(void *)(*(long *)(in_RDI + 0x18) + 0x40),0x68);
  if (local_30 != 0) {
    (*local_40)(local_70);
  }
  if (*(long *)(in_RDI + 0x50) != 0) {
    ktxHashList_Destruct(in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_RDI + 0x60) != 0) {
    free(*(void **)(in_RDI + 0x60));
  }
  if (*(long *)(in_RDI + 0x70) != 0) {
    free(*(void **)(in_RDI + 0x70));
  }
  free(*(void **)(in_RDI + 0x18));
  return;
}

Assistant:

void
ktxTexture_destruct(ktxTexture* This)
{
    ktxStream stream = *(ktxTexture_getStream(This));

    if (stream.data.file != NULL)
        stream.destruct(&stream);
    if (This->kvDataHead != NULL)
        ktxHashList_Destruct(&This->kvDataHead);
    if (This->kvData != NULL)
        free(This->kvData);
    if (This->pData != NULL)
        free(This->pData);
    free(This->_protected);
}